

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello-window.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  handle = glfwCreateWindow(800,600,"Hello OpenGL Window",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    printf("window creation failed!\n");
    glfwTerminate();
    argv_local._4_4_ = -1;
  }
  else {
    glfwMakeContextCurrent(handle);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      printf("window creation failed!\n");
      argv_local._4_4_ = -1;
    }
    else {
      while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
        (*glad_glClearColor)(0.2,0.3,0.3,1.0);
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(handle);
        glfwPollEvents();
      }
      glfwTerminate();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
	glfwInit();
	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	GLFWwindow* window = glfwCreateWindow(800, 600, "Hello OpenGL Window", NULL, NULL);
	if (window == NULL)
	{
		printf("window creation failed!\n");
		glfwTerminate();
		return -1;
	}
	glfwMakeContextCurrent(window);

	if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress))
	{
		printf("window creation failed!\n");
		return -1;
	}

	while (!glfwWindowShouldClose(window))
	{
		glClearColor(0.2f, 0.3f, 0.3f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT);
		glfwSwapBuffers(window);
		glfwPollEvents();
	}

	glfwTerminate();

	return 0;
}